

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O1

TaggedShapeFactory *
s2shapeutil::FullDecodeShapeFactory(TaggedShapeFactory *__return_storage_ptr__,Decoder *decoder)

{
  ShapeDecoder local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_function_pointer = FullDecodeShape;
  local_28._M_invoker =
       std::
       _Function_handler<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*),_std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(*)(unsigned_int,_Decoder_*)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*),_std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(*)(unsigned_int,_Decoder_*)>
       ::_M_manager;
  TaggedShapeFactory::TaggedShapeFactory(__return_storage_ptr__,&local_28,decoder);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

TaggedShapeFactory FullDecodeShapeFactory(Decoder* decoder) {
  return TaggedShapeFactory(FullDecodeShape, decoder);
}